

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O3

void __thiscall
fasttext::Loss::findKBest(Loss *this,int32_t k,real threshold,Predictions *heap,Vector *output)

{
  float fVar1;
  pointer pfVar2;
  iterator __position;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  _Var3;
  pair<float,_int> __value;
  pointer pfVar4;
  undefined4 extraout_var;
  pointer ppVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  pair<float,_int> local_40;
  float local_34;
  
  pfVar4 = (output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar2 = (output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pfVar2 != pfVar4 && -1 < (long)pfVar2 - (long)pfVar4) {
    lVar6 = 0;
    lVar7 = 0;
    local_34 = threshold;
    do {
      fVar1 = pfVar4[lVar7];
      if (local_34 <= fVar1) {
        if ((long)(heap->
                  super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(heap->
                  super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 3 == (long)k) {
          dVar8 = ::log((double)fVar1 + 1e-05);
          if ((float)dVar8 <
              ((heap->
               super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_start)->first) goto LAB_00132ad1;
          fVar1 = (output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar7];
        }
        dVar8 = ::log((double)fVar1 + 1e-05);
        local_40 = (pair<float,_int>)(CONCAT44(extraout_var,(float)dVar8) + lVar6);
        __position._M_current =
             (heap->
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (heap->
            super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>::
          _M_realloc_insert<std::pair<float,int>>
                    ((vector<std::pair<float,int>,std::allocator<std::pair<float,int>>> *)heap,
                     __position,&local_40);
          ppVar5 = (heap->
                   super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          *__position._M_current = local_40;
          ppVar5 = (heap->
                   super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish + 1;
          (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
          ._M_impl.super__Vector_impl_data._M_finish = ppVar5;
        }
        _Var3._M_current =
             (heap->
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
        local_40 = (pair<float,_int>)comparePairs;
        std::
        __push_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,long,std::pair<float,int>,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>>
                  (_Var3,((long)ppVar5 - (long)_Var3._M_current >> 3) + -1,0,ppVar5[-1],
                   (_Iter_comp_val<bool_(*)(const_std::pair<float,_int>_&,_const_std::pair<float,_int>_&)>
                    *)&local_40);
        _Var3._M_current =
             (heap->
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
        ppVar5 = (heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((ulong)(long)k < (ulong)((long)ppVar5 - (long)_Var3._M_current >> 3)) {
          if (8 < (long)ppVar5 - (long)_Var3._M_current) {
            __value = ppVar5[-1];
            ppVar5[-1].first = (_Var3._M_current)->first;
            ppVar5[-1].second = (_Var3._M_current)->second;
            std::
            __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,long,std::pair<float,int>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>>
                      (_Var3,0,(long)ppVar5 + (-8 - (long)_Var3._M_current) >> 3,__value,
                       (_Iter_comp_iter<bool_(*)(const_std::pair<float,_int>_&,_const_std::pair<float,_int>_&)>
                        )comparePairs);
            ppVar5 = (heap->
                     super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          }
          (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
          ._M_impl.super__Vector_impl_data._M_finish = ppVar5 + -1;
        }
      }
LAB_00132ad1:
      lVar7 = lVar7 + 1;
      pfVar4 = (output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x100000000;
    } while (lVar7 < (long)(output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_finish - (long)pfVar4 >> 2);
  }
  return;
}

Assistant:

void Loss::findKBest(
    int32_t k,
    real threshold,
    Predictions& heap,
    const Vector& output) const {
  for (int32_t i = 0; i < output.size(); i++) {
    if (output[i] < threshold) {
      continue;
    }
    if (heap.size() == k && std_log(output[i]) < heap.front().first) {
      continue;
    }
    heap.push_back(std::make_pair(std_log(output[i]), i));
    std::push_heap(heap.begin(), heap.end(), comparePairs);
    if (heap.size() > k) {
      std::pop_heap(heap.begin(), heap.end(), comparePairs);
      heap.pop_back();
    }
  }
}